

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-contact-ekf-flex-estimator-imu.cpp
# Opt level: O3

void __thiscall
stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
setMeasurementNoiseCovariance(FixedContactEKFFlexEstimatorIMU *this,Matrix *R)

{
  Index IVar1;
  int iVar2;
  assign_op<double,_double> local_19;
  
  IVar1 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  iVar2 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])();
  if (iVar2 == (int)IVar1) {
    IVar1 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
    iVar2 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
              _vptr_FlexibilityEstimatorBase[0x14])(this);
    if (iVar2 == (int)IVar1) {
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                (&this->R_,R,&local_19);
      (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
        _vptr_FlexibilityEstimatorBase[0x22])(this);
      return;
    }
  }
  __assert_fail("unsigned(R.rows())==getMeasurementSize() && unsigned(R.cols())==getMeasurementSize() && \"ERROR: The measurement noise covariance matrix R has                         incorrect size\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/fixed-contact-ekf-flex-estimator-imu.cpp"
                ,0x9b,
                "virtual void stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setMeasurementNoiseCovariance(const Matrix &)"
               );
}

Assistant:

void FixedContactEKFFlexEstimatorIMU::setMeasurementNoiseCovariance
                                            (const Matrix & R)
    {
        BOOST_ASSERT(unsigned(R.rows())==getMeasurementSize() &&
                     unsigned(R.cols())==getMeasurementSize() &&
                    "ERROR: The measurement noise covariance matrix R has \
                        incorrect size");

        R_=R;
        updateCovarianceMatrix_();
    }